

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::XFBCaptureInactiveOutputVariableTest::getBufferDescriptors
          (XFBCaptureInactiveOutputVariableTest *this,GLuint param_1,Vector *out_descriptors)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  const_reference pvVar4;
  uint local_8c;
  GLuint i;
  GLuint type_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *goten_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *gohan_data;
  bufferDescriptor *xfb;
  bufferDescriptor *uniform;
  Type *type;
  Vector *out_descriptors_local;
  XFBCaptureInactiveOutputVariableTest *pXStack_10;
  GLuint param_1_local;
  XFBCaptureInactiveOutputVariableTest *this_local;
  
  uniform = (bufferDescriptor *)&Utils::Type::vec4;
  type = (Type *)out_descriptors;
  out_descriptors_local._4_4_ = param_1;
  pXStack_10 = this;
  std::
  vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
  ::resize(out_descriptors,2);
  xfb = std::
        vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
        ::operator[]((vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
                      *)type,0);
  gohan_data = &std::
                vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
                ::operator[]((vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
                              *)type,1)->m_expected_data;
  xfb->m_index = 0;
  ((reference)gohan_data)->m_index = 0;
  xfb->m_target = Uniform;
  ((reference)gohan_data)->m_target = Transform_feedback;
  Utils::Type::GenerateData
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&goten_data,
             (Type *)&Utils::Type::vec4);
  local_40 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&goten_data;
  Utils::Type::GenerateData(&local_78,(Type *)&Utils::Type::vec4);
  local_60 = &local_78;
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_40);
  iVar1 = (int)sVar2;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&xfb->m_initial_data,(ulong)(uint)(iVar1 * 2));
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&xfb->m_initial_data,0);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_40,0);
  memcpy(pvVar3,pvVar4,sVar2 & 0xffffffff);
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&xfb->m_initial_data,0);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_60,0);
  memcpy(pvVar3 + (sVar2 & 0xffffffff),pvVar4,sVar2 & 0xffffffff);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (gohan_data + 1,(ulong)(uint)(iVar1 * 3));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (gohan_data,(ulong)(uint)(iVar1 * 3));
  for (local_8c = 0; local_8c < (uint)(iVar1 * 3); local_8c = local_8c + 1) {
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (gohan_data + 1,(ulong)local_8c);
    *pvVar3 = (value_type)local_8c;
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (gohan_data,(ulong)local_8c);
    *pvVar3 = (value_type)local_8c;
  }
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](gohan_data,0);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_40,0);
  memcpy(pvVar3 + (uint)(iVar1 << 1),pvVar4,sVar2 & 0xffffffff);
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](gohan_data,0);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_60,0);
  memcpy(pvVar3,pvVar4,sVar2 & 0xffffffff);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_78);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&goten_data);
  return;
}

Assistant:

void XFBCaptureInactiveOutputVariableTest::getBufferDescriptors(glw::GLuint /* test_case_index */,
																bufferDescriptor::Vector& out_descriptors)
{
	const Utils::Type& type = Utils::Type::vec4;

	/* Test needs single uniform and xfb */
	out_descriptors.resize(2);

	/* Get references */
	bufferDescriptor& uniform = out_descriptors[0];
	bufferDescriptor& xfb	 = out_descriptors[1];

	/* Index */
	uniform.m_index = 0;
	xfb.m_index		= 0;

	/* Target */
	uniform.m_target = Utils::Buffer::Uniform;
	xfb.m_target	 = Utils::Buffer::Transform_feedback;

	/* Data */
	const std::vector<GLubyte>& gohan_data = type.GenerateData();
	const std::vector<GLubyte>& goten_data = type.GenerateData();

	const GLuint type_size = static_cast<GLuint>(gohan_data.size());

	/* Uniform data */
	uniform.m_initial_data.resize(2 * type_size);
	memcpy(&uniform.m_initial_data[0] + 0, &gohan_data[0], type_size);
	memcpy(&uniform.m_initial_data[0] + type_size, &goten_data[0], type_size);

	/* XFB data */
	xfb.m_initial_data.resize(3 * type_size);
	xfb.m_expected_data.resize(3 * type_size);

	for (GLuint i = 0; i < 3 * type_size; ++i)
	{
		xfb.m_initial_data[i]  = (glw::GLubyte)i;
		xfb.m_expected_data[i] = (glw::GLubyte)i;
	}

	memcpy(&xfb.m_expected_data[0] + 2 * type_size, &gohan_data[0], type_size);
	memcpy(&xfb.m_expected_data[0] + 0 * type_size, &goten_data[0], type_size);
}